

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr.c
# Opt level: O2

int netaddr_cmp_to_socket(netaddr *a1,netaddr_socket *a2)

{
  int iVar1;
  uint uVar2;
  in_addr *__s2;
  size_t sStack_20;
  
  uVar2 = (uint)a1->_type;
  iVar1 = uVar2 - (a2->v4).sin_family;
  if (iVar1 != 0) {
    return iVar1;
  }
  if (a1->_type == 10) {
    __s2 = (in_addr *)(a2->v4).sin_zero;
    sStack_20 = 0x10;
  }
  else {
    if (uVar2 != 2) goto LAB_00109f90;
    __s2 = &(a2->v4).sin_addr;
    sStack_20 = 4;
  }
  iVar1 = memcmp(a1,__s2,sStack_20);
  if (iVar1 != 0) {
    return iVar1;
  }
LAB_00109f90:
  iVar1 = a1->_prefix_len - 0x20;
  if (uVar2 != 2) {
    iVar1 = a1->_prefix_len - 0x80;
  }
  return iVar1;
}

Assistant:

int
netaddr_cmp_to_socket(const struct netaddr *a1, const union netaddr_socket *a2) {
  int result = 0;

  result = (int)a1->_type - (int)a2->std.sa_family;
  if (result) {
    return result;
  }

  if (a1->_type == AF_INET) {
    result = memcmp(a1->_addr, &a2->v4.sin_addr, 4);
  }
  else if (a1->_type == AF_INET6) {
    /* ipv6 */
    result = memcmp(a1->_addr, &a2->v6.sin6_addr, 16);
  }

  if (result) {
    return result;
  }

  return (int)a1->_prefix_len - (a1->_type == AF_INET ? 32 : 128);
}